

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void free_var_ref(JSRuntime *rt,JSVarRef *var_ref)

{
  JSValue v;
  int iVar1;
  JSRuntime *in_RSI;
  JSValueUnion in_RDI;
  int64_t unaff_retaddr;
  void *in_stack_ffffffffffffffe8;
  
  if ((in_RSI != (JSRuntime *)0x0) &&
     (iVar1 = *(int *)&(in_RSI->mf).js_malloc + -1, *(int *)&(in_RSI->mf).js_malloc = iVar1,
     iVar1 == 0)) {
    if (((ulong)(in_RSI->mf).js_malloc & 0x10000000000) == 0) {
      list_del((list_head *)&(in_RSI->mf).js_free);
    }
    else {
      v.tag = unaff_retaddr;
      v.u.float64 = in_RDI.float64;
      JS_FreeValueRT(in_RSI,v);
      remove_gc_object((JSGCObjectHeader *)0x12fdc6);
    }
    js_free_rt(in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

static void free_var_ref(JSRuntime *rt, JSVarRef *var_ref)
{
    if (var_ref) {
        assert(var_ref->header.ref_count > 0);
        if (--var_ref->header.ref_count == 0) {
            if (var_ref->is_detached) {
                JS_FreeValueRT(rt, var_ref->value);
                remove_gc_object(&var_ref->header);
            } else {
                list_del(&var_ref->header.link); /* still on the stack */
            }
            js_free_rt(rt, var_ref);
        }
    }
}